

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_adaptor.hpp
# Opt level: O0

void __thiscall
io::basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>>::
basic_adaptor<char_const(&)[12],void>
          (basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>> *this,
          char (*args) [12])

{
  allocator<char> local_39;
  string_type local_38;
  char (*local_18) [12];
  char (*args_local) [12];
  basic_adaptor<io::basic_string_stream<char,_std::char_traits<char>_>_> *this_local;
  
  local_18 = args;
  args_local = (char (*) [12])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,*args,&local_39);
  basic_string_stream<char,_std::char_traits<char>_>::basic_string_stream
            ((basic_string_stream<char,_std::char_traits<char>_> *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

basic_adaptor(Args&&... args)
            : stream_(std::forward<Args>(args)...)
    {}